

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O3

void Proof_CollectUsed_rec(Vec_Set_t *vProof,int hNode,Vec_Int_t *vUsed)

{
  word *pwVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (0 < hNode) {
    uVar5 = (ulong)(vProof->uPageMask & hNode);
    if (*(int *)((long)vProof->pPages[(uint)hNode >> ((byte)vProof->nPageSize & 0x1f)] +
                uVar5 * 8 + 4) != 0) {
      return;
    }
    pwVar1 = vProof->pPages[(uint)hNode >> ((byte)vProof->nPageSize & 0x1f)] + uVar5;
    *(uint *)((long)pwVar1 + 4) = 1;
    uVar3 = (uint)*pwVar1;
    if (7 < uVar3) {
      uVar5 = 0;
      do {
        uVar2 = *(uint *)((long)pwVar1 + uVar5 * 4 + 8);
        if ((uVar2 & 1) == 0) {
          uVar4 = (int)uVar2 >> 2;
          if ((int)uVar4 < 1) goto LAB_00935d8e;
          if ((vProof->pPages[uVar4 >> ((byte)vProof->nPageSize & 0x1f)] != (word *)0x0) &&
             (*(int *)((long)vProof->pPages[uVar4 >> ((byte)vProof->nPageSize & 0x1f)] +
                      (ulong)(uVar4 & vProof->uPageMask) * 8 + 4) == 0)) {
            Proof_CollectUsed_rec(vProof,uVar2 >> 2,vUsed);
            uVar3 = (uint)*pwVar1;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3 >> 3);
    }
    Vec_IntPush(vUsed,hNode);
    return;
  }
LAB_00935d8e:
  __assert_fail("h > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                ,0x3a,"satset *Proof_NodeRead(Vec_Set_t *, int)");
}

Assistant:

void Proof_CollectUsed_rec( Vec_Set_t * vProof, int hNode, Vec_Int_t * vUsed )
{
    satset * pNext, * pNode = Proof_NodeRead( vProof, hNode );
    int i;
    if ( pNode->Id )
        return;
    pNode->Id = 1;
    Proof_NodeForeachFanin( vProof, pNode, pNext, i )
        if ( pNext && !pNext->Id )
            Proof_CollectUsed_rec( vProof, pNode->pEnts[i] >> 2, vUsed );
    Vec_IntPush( vUsed, hNode );
}